

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrenum.cpp
# Opt level: O1

UChar * ucharstrenum_unext(UEnumeration *en,int32_t *resultLength,UErrorCode *param_3)

{
  int iVar1;
  void *pvVar2;
  int32_t iVar3;
  UChar *s;
  
  iVar1 = *(int *)&en[1].baseContext;
  if (iVar1 < *(int *)((long)&en[1].baseContext + 4)) {
    pvVar2 = en->context;
    *(int *)&en[1].baseContext = iVar1 + 1;
    s = *(UChar **)((long)pvVar2 + (long)iVar1 * 8);
    if (resultLength != (int32_t *)0x0) {
      iVar3 = u_strlen_63(s);
      *resultLength = iVar3;
    }
  }
  else {
    s = (UChar *)0x0;
  }
  return s;
}

Assistant:

static const UChar* U_CALLCONV
ucharstrenum_unext(UEnumeration* en,
                  int32_t* resultLength,
                  UErrorCode* /*ec*/) {
    UCharStringEnumeration *e = (UCharStringEnumeration*) en;
    if (e->index >= e->count) {
        return NULL;
    }
    const UChar* result = ((const UChar**)e->uenum.context)[e->index++];
    if (resultLength) {
        *resultLength = (int32_t)u_strlen(result);
    }
    return result;
}